

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_capa_resp(connectdata *conn,int pop3code,pop3state instate)

{
  SessionHandle *data_00;
  int iVar1;
  char *__s;
  size_t sVar2;
  bool bVar3;
  ulong local_48;
  size_t wordlen;
  size_t len;
  char *line;
  pop3_conn *pop3c;
  SessionHandle *data;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  __s = (data_00->state).buffer;
  sVar2 = strlen(__s);
  if (pop3code == 0x2a) {
    if ((sVar2 < 4) || (*(int *)__s != 0x534c5453)) {
      if ((sVar2 < 4) || (*(int *)__s != 0x52455355)) {
        if ((4 < sVar2) && (iVar1 = memcmp(__s,"SASL ",5), iVar1 == 0)) {
          (conn->proto).pop3c.authtypes = (conn->proto).pop3c.authtypes | 4;
          len = (size_t)((data_00->state).buffer + 5);
          wordlen = sVar2 - 5;
          while( true ) {
            while( true ) {
              bVar3 = false;
              if ((((wordlen != 0) && (bVar3 = true, *(char *)len != ' ')) &&
                  (bVar3 = true, *(char *)len != '\t')) && (bVar3 = true, *(char *)len != '\r')) {
                bVar3 = *(char *)len == '\n';
              }
              if (!bVar3) break;
              len = len + 1;
              wordlen = wordlen - 1;
            }
            if (wordlen == 0) break;
            local_48 = 0;
            while( true ) {
              bVar3 = false;
              if (((local_48 < wordlen) && (bVar3 = false, *(char *)(len + local_48) != ' ')) &&
                 ((bVar3 = false, *(char *)(len + local_48) != '\t' &&
                  (bVar3 = false, *(char *)(len + local_48) != '\r')))) {
                bVar3 = *(char *)(len + local_48) != '\n';
              }
              if (!bVar3) break;
              local_48 = local_48 + 1;
            }
            if ((local_48 == 5) && (iVar1 = memcmp((void *)len,"LOGIN",5), iVar1 == 0)) {
              (conn->proto).pop3c.authmechs = (conn->proto).pop3c.authmechs | 1;
            }
            else if ((local_48 == 5) && (iVar1 = memcmp((void *)len,"PLAIN",5), iVar1 == 0)) {
              (conn->proto).pop3c.authmechs = (conn->proto).pop3c.authmechs | 2;
            }
            else if ((local_48 == 8) && (iVar1 = memcmp((void *)len,"CRAM-MD5",8), iVar1 == 0)) {
              (conn->proto).pop3c.authmechs = (conn->proto).pop3c.authmechs | 4;
            }
            else if ((local_48 == 10) && (iVar1 = memcmp((void *)len,"DIGEST-MD5",10), iVar1 == 0))
            {
              (conn->proto).pop3c.authmechs = (conn->proto).pop3c.authmechs | 8;
            }
            else if ((local_48 == 6) && (iVar1 = memcmp((void *)len,"GSSAPI",6), iVar1 == 0)) {
              (conn->proto).pop3c.authmechs = (conn->proto).pop3c.authmechs | 0x10;
            }
            else if ((local_48 == 8) && (iVar1 = memcmp((void *)len,"EXTERNAL",8), iVar1 == 0)) {
              (conn->proto).pop3c.authmechs = (conn->proto).pop3c.authmechs | 0x20;
            }
            else if ((local_48 == 4) && (iVar1 = memcmp((void *)len,"NTLM",4), iVar1 == 0)) {
              (conn->proto).pop3c.authmechs = (conn->proto).pop3c.authmechs | 0x40;
            }
            else if ((local_48 == 7) && (iVar1 = memcmp((void *)len,"XOAUTH2",7), iVar1 == 0)) {
              (conn->proto).pop3c.authmechs = (conn->proto).pop3c.authmechs | 0x80;
            }
            len = local_48 + len;
            wordlen = wordlen - local_48;
          }
        }
      }
      else {
        (conn->proto).pop3c.authtypes = (conn->proto).pop3c.authtypes | 1;
      }
    }
    else {
      (conn->proto).pop3c.tls_supported = true;
    }
  }
  else if (pop3code == 0x2b) {
    if (((data_00->set).use_ssl == CURLUSESSL_NONE) || ((conn->ssl[0].use & 1U) != 0)) {
      data._4_4_ = pop3_perform_authentication(conn);
    }
    else if (((conn->proto).pop3c.tls_supported & 1U) == 0) {
      if ((data_00->set).use_ssl == CURLUSESSL_TRY) {
        data._4_4_ = pop3_perform_authentication(conn);
      }
      else {
        Curl_failf(data_00,"STLS not supported.");
        data._4_4_ = CURLE_USE_SSL_FAILED;
      }
    }
    else {
      data._4_4_ = pop3_perform_starttls(conn);
    }
  }
  else {
    (conn->proto).pop3c.authtypes = (conn->proto).pop3c.authtypes | 1;
    data._4_4_ = pop3_perform_authentication(conn);
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_capa_resp(struct connectdata *conn, int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *line = data->state.buffer;
  size_t len = strlen(line);
  size_t wordlen;

  (void)instate; /* no use for this yet */

  /* Do we have a untagged response? */
  if(pop3code == '*') {
    /* Does the server support the STLS capability? */
    if(len >= 4 && !memcmp(line, "STLS", 4))
      pop3c->tls_supported = TRUE;

    /* Does the server support clear text authentication? */
    else if(len >= 4 && !memcmp(line, "USER", 4))
      pop3c->authtypes |= POP3_TYPE_CLEARTEXT;

    /* Does the server support SASL based authentication? */
    else if(len >= 5 && !memcmp(line, "SASL ", 5)) {
      pop3c->authtypes |= POP3_TYPE_SASL;

      /* Advance past the SASL keyword */
      line += 5;
      len -= 5;

      /* Loop through the data line */
      for(;;) {
        while(len &&
              (*line == ' ' || *line == '\t' ||
               *line == '\r' || *line == '\n')) {

          line++;
          len--;
        }

        if(!len)
          break;

        /* Extract the word */
        for(wordlen = 0; wordlen < len && line[wordlen] != ' ' &&
              line[wordlen] != '\t' && line[wordlen] != '\r' &&
              line[wordlen] != '\n';)
          wordlen++;

        /* Test the word for a matching authentication mechanism */
        if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_LOGIN))
          pop3c->authmechs |= SASL_MECH_LOGIN;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_PLAIN))
          pop3c->authmechs |= SASL_MECH_PLAIN;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_CRAM_MD5))
          pop3c->authmechs |= SASL_MECH_CRAM_MD5;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_DIGEST_MD5))
          pop3c->authmechs |= SASL_MECH_DIGEST_MD5;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_GSSAPI))
          pop3c->authmechs |= SASL_MECH_GSSAPI;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_EXTERNAL))
          pop3c->authmechs |= SASL_MECH_EXTERNAL;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_NTLM))
          pop3c->authmechs |= SASL_MECH_NTLM;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_XOAUTH2))
          pop3c->authmechs |= SASL_MECH_XOAUTH2;

        line += wordlen;
        len -= wordlen;
      }
    }
  }
  else if(pop3code == '+') {
    if(data->set.use_ssl && !conn->ssl[FIRSTSOCKET].use) {
      /* We don't have a SSL/TLS connection yet, but SSL is requested */
      if(pop3c->tls_supported)
        /* Switch to TLS connection now */
        result = pop3_perform_starttls(conn);
      else if(data->set.use_ssl == CURLUSESSL_TRY)
        /* Fallback and carry on with authentication */
        result = pop3_perform_authentication(conn);
      else {
        failf(data, "STLS not supported.");
        result = CURLE_USE_SSL_FAILED;
      }
    }
    else
      result = pop3_perform_authentication(conn);
  }
  else {
    /* Clear text is supported when CAPA isn't recognised */
    pop3c->authtypes |= POP3_TYPE_CLEARTEXT;

    result = pop3_perform_authentication(conn);
  }

  return result;
}